

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ShaderSubroutine::FunctionalTest13::iterate(FunctionalTest13 *this)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  code *pcVar5;
  bool bVar6;
  int iVar7;
  uint n_fs_id;
  uint n_gs_id;
  uint n_tc_id;
  uint n_te_id;
  uint n_vs_id;
  deUint32 dVar8;
  GLuint GVar9;
  uint uVar10;
  uint n_gs_subroutine_00;
  uint n_tc_subroutine_00;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  ContextInfo *pCVar12;
  NotSupportedError *pNVar13;
  TestError *pTVar14;
  ostream *poVar15;
  undefined8 uVar16;
  TestLog *pTVar17;
  MessageBuilder *pMVar18;
  int local_cac;
  int local_ca8;
  int i;
  anon_struct_16_3_b1a479ae configurations [5];
  uint n_vs_subroutine;
  uint n_te_subroutine;
  uint n_tc_subroutine;
  uint n_gs_subroutine;
  uint n_fs_subroutine;
  int n_subroutine_permutation;
  MessageBuilder local_ac0;
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  stringstream local_8a0 [8];
  stringstream vs_subroutine_name_sstream;
  ostream local_890;
  stringstream local_718 [8];
  stringstream te_subroutine_name_sstream;
  ostream local_708;
  stringstream local_590 [8];
  stringstream tc_subroutine_name_sstream;
  ostream local_580;
  stringstream local_408 [8];
  stringstream gs_subroutine_name_sstream;
  ostream local_3f8;
  stringstream local_280 [8];
  stringstream fs_subroutine_name_sstream;
  ostream local_270;
  uint local_f4;
  int local_f0;
  uint n_subroutine;
  GLint vs_subroutine_uniform_index;
  GLuint vs_subroutine_indices [2];
  GLint te_subroutine_uniform_index;
  GLuint te_subroutine_indices [2];
  GLint tc_subroutine_uniform_index;
  GLuint tc_subroutine_indices [2];
  GLint gs_subroutine_uniform_index;
  GLuint gs_subroutine_indices [2];
  GLint fs_subroutine_uniform_index;
  GLuint fs_subroutine_indices [2];
  GLint validate_status;
  uint vs_po_id;
  uint te_po_id;
  uint tc_po_id;
  uint gs_po_id;
  uint fs_po_id;
  uint n_vs_idx;
  uint n_te_idx;
  uint n_tc_idx;
  uint n_gs_idx;
  uint n_fs_idx;
  int n_shader_permutation;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  undefined8 *local_28;
  Functions *gl;
  FunctionalTest13 *this_local;
  
  gl = (Functions *)this;
  pRVar11 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar7 = (*pRVar11->_vptr_RenderContext[3])();
  local_28 = (undefined8 *)CONCAT44(extraout_var,iVar7);
  pCVar12 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar6 = glu::ContextInfo::isExtensionSupported(pCVar12,"GL_ARB_shader_subroutine");
  if (!bVar6) {
    local_5d = 1;
    pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"GL_ARB_shader_subroutine is not supported.",&local_49);
    tcu::NotSupportedError::NotSupportedError(pNVar13,&local_48);
    local_5d = 0;
    __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pCVar12 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar6 = glu::ContextInfo::isExtensionSupported(pCVar12,"GL_ARB_separate_shader_objects");
  if (!bVar6) {
    n_fs_idx._2_1_ = 1;
    pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&n_shader_permutation,"GL_ARB_separate_shader_objects is not supported",
               (allocator<char> *)((long)&n_fs_idx + 3));
    tcu::NotSupportedError::NotSupportedError(pNVar13,(string *)&n_shader_permutation);
    n_fs_idx._2_1_ = 0;
    __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  n_gs_idx = 0;
  while( true ) {
    if (0x1f < (int)n_gs_idx) {
      if ((this->m_has_test_passed & 1U) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      return STOP;
    }
    n_fs_id = (uint)((n_gs_idx & 1) != 0);
    n_gs_id = (uint)((n_gs_idx & 2) != 0);
    n_tc_id = (uint)((n_gs_idx & 4) != 0);
    n_te_id = (uint)((n_gs_idx & 8) != 0);
    n_vs_id = (uint)((n_gs_idx & 0x10) != 0);
    GVar1 = this->m_fs_po_ids[n_fs_id];
    GVar2 = this->m_gs_po_ids[n_gs_id];
    GVar3 = this->m_tc_po_ids[n_tc_id];
    GVar4 = this->m_te_po_ids[n_te_id];
    fs_subroutine_indices[1] = this->m_vs_po_ids[n_vs_id];
    (*(code *)local_28[0x2d1])(this->m_pipeline_id,2,GVar1);
    dVar8 = (*(code *)local_28[0x100])();
    glu::checkError(dVar8,"glUseProgramStages() call failed for GL_FRAGMENT_SHADER_BIT bit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1bf7);
    (*(code *)local_28[0x2d1])(this->m_pipeline_id,4,GVar2);
    dVar8 = (*(code *)local_28[0x100])();
    glu::checkError(dVar8,"glUseProgramStages() call failed for GL_GEOMETRY_SHADER_BIT bit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1bfb);
    (*(code *)local_28[0x2d1])(this->m_pipeline_id,8,GVar3);
    dVar8 = (*(code *)local_28[0x100])();
    glu::checkError(dVar8,"glUseProgramStages() call failed for GL_TESS_CONTROL_SHADER_BIT bit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1bff);
    (*(code *)local_28[0x2d1])(this->m_pipeline_id,0x10,GVar4);
    dVar8 = (*(code *)local_28[0x100])();
    glu::checkError(dVar8,"glUseProgramStages() call failed for GL_TESS_EVALUATION_SHADER_BIT bit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1c03);
    (*(code *)local_28[0x2d1])(this->m_pipeline_id,1,fs_subroutine_indices[1]);
    dVar8 = (*(code *)local_28[0x100])();
    glu::checkError(dVar8,"glUseProgramStages() call failed for GL_VERTEX_SHADER_BIT bit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1c07);
    fs_subroutine_indices[0] = 0;
    (*(code *)local_28[0x2d3])(this->m_pipeline_id);
    dVar8 = (*(code *)local_28[0x100])();
    glu::checkError(dVar8,"glValidateProgramPipeline() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1c0d);
    (*(code *)local_28[0x134])(this->m_pipeline_id,0x8b83,fs_subroutine_indices);
    dVar8 = (*(code *)local_28[0x100])();
    glu::checkError(dVar8,"glGetProgramPipelineiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1c10);
    if (fs_subroutine_indices[0] != 1) {
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar14,"Program pipeline has not been validated successfully.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x1c14);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    stack0xffffffffffffff44 = 0xffffffff;
    gs_subroutine_indices[0] = 0;
    stack0xffffffffffffff38 = 0xffffffff;
    tc_subroutine_indices[0] = 0;
    stack0xffffffffffffff2c = 0xffffffff;
    te_subroutine_indices[0] = 0;
    stack0xffffffffffffff20 = 0xffffffff;
    vs_subroutine_indices[0] = 0;
    _n_subroutine = 0xffffffff;
    local_f0 = 0;
    for (local_f4 = 0; local_f4 < 2; local_f4 = local_f4 + 1) {
      std::__cxx11::stringstream::stringstream(local_280);
      std::__cxx11::stringstream::stringstream(local_408);
      std::__cxx11::stringstream::stringstream(local_590);
      std::__cxx11::stringstream::stringstream(local_718);
      std::__cxx11::stringstream::stringstream(local_8a0);
      poVar15 = std::operator<<(&local_270,"SubroutineFS");
      std::ostream::operator<<(poVar15,local_f4 + 1);
      poVar15 = std::operator<<(&local_3f8,"SubroutineGS");
      std::ostream::operator<<(poVar15,local_f4 + 1);
      poVar15 = std::operator<<(&local_580,"SubroutineTC");
      std::ostream::operator<<(poVar15,local_f4 + 1);
      poVar15 = std::operator<<(&local_708,"SubroutineTE");
      std::ostream::operator<<(poVar15,local_f4 + 1);
      poVar15 = std::operator<<(&local_890,"SubroutineVS");
      std::ostream::operator<<(poVar15,local_f4 + 1);
      pcVar5 = (code *)local_28[0x151];
      std::__cxx11::stringstream::str();
      uVar16 = std::__cxx11::string::c_str();
      GVar9 = (*pcVar5)(GVar1,0x8b30,uVar16);
      gs_subroutine_indices[(ulong)local_f4 + 1] = GVar9;
      std::__cxx11::string::~string(local_8c0);
      pcVar5 = (code *)local_28[0x151];
      std::__cxx11::stringstream::str();
      uVar16 = std::__cxx11::string::c_str();
      GVar9 = (*pcVar5)(GVar2,0x8dd9,uVar16);
      tc_subroutine_indices[(ulong)local_f4 + 1] = GVar9;
      std::__cxx11::string::~string(local_8e0);
      pcVar5 = (code *)local_28[0x151];
      std::__cxx11::stringstream::str();
      uVar16 = std::__cxx11::string::c_str();
      GVar9 = (*pcVar5)(GVar3,0x8e88,uVar16);
      te_subroutine_indices[(ulong)local_f4 + 1] = GVar9;
      std::__cxx11::string::~string(local_900);
      pcVar5 = (code *)local_28[0x151];
      std::__cxx11::stringstream::str();
      uVar16 = std::__cxx11::string::c_str();
      GVar9 = (*pcVar5)(GVar4,0x8e87,uVar16);
      vs_subroutine_indices[(ulong)local_f4 + 1] = GVar9;
      std::__cxx11::string::~string(local_920);
      GVar9 = fs_subroutine_indices[1];
      pcVar5 = (code *)local_28[0x151];
      std::__cxx11::stringstream::str();
      uVar16 = std::__cxx11::string::c_str();
      uVar10 = (*pcVar5)(GVar9,0x8b31,uVar16);
      (&n_subroutine)[local_f4] = uVar10;
      std::__cxx11::string::~string(local_940);
      dVar8 = (*(code *)local_28[0x100])();
      glu::checkError(dVar8,"glGetSubroutineIndex() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1c3b);
      if ((((gs_subroutine_indices[(ulong)local_f4 + 1] == 0xffffffff) ||
           (tc_subroutine_indices[(ulong)local_f4 + 1] == 0xffffffff)) ||
          (te_subroutine_indices[(ulong)local_f4 + 1] == 0xffffffff)) ||
         ((vs_subroutine_indices[(ulong)local_f4 + 1] == 0xffffffff ||
          ((&n_subroutine)[local_f4] == 0xffffffff)))) {
        pTVar17 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_ac0,pTVar17,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar18 = tcu::MessageBuilder::operator<<
                            (&local_ac0,
                             (char (*) [80])
                             "At least one subroutine was not recognized by glGetSubroutineIndex() call. (fs:"
                            );
        pMVar18 = tcu::MessageBuilder::operator<<
                            (pMVar18,gs_subroutine_indices + (ulong)local_f4 + 1);
        pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [6])", gs:");
        pMVar18 = tcu::MessageBuilder::operator<<
                            (pMVar18,tc_subroutine_indices + (ulong)local_f4 + 1);
        pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [6])", tc:");
        pMVar18 = tcu::MessageBuilder::operator<<
                            (pMVar18,te_subroutine_indices + (ulong)local_f4 + 1);
        pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [6])", te:");
        pMVar18 = tcu::MessageBuilder::operator<<
                            (pMVar18,vs_subroutine_indices + (ulong)local_f4 + 1);
        pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [6])", vs:");
        pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,&n_subroutine + local_f4);
        pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [3])0x2c156ab);
        tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_ac0);
        pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar14,"At least one subroutine was not recognized",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x1c4c);
        __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      std::__cxx11::stringstream::~stringstream(local_8a0);
      std::__cxx11::stringstream::~stringstream(local_718);
      std::__cxx11::stringstream::~stringstream(local_590);
      std::__cxx11::stringstream::~stringstream(local_408);
      std::__cxx11::stringstream::~stringstream(local_280);
    }
    gs_subroutine_indices[0] = (*(code *)local_28[0x152])(GVar1,0x8b30,"function");
    tc_subroutine_indices[0] = (*(code *)local_28[0x152])(GVar2,0x8dd9,"function");
    te_subroutine_indices[0] = (*(code *)local_28[0x152])(GVar3,0x8e88,"function");
    vs_subroutine_indices[0] = (*(code *)local_28[0x152])(GVar4,0x8e87,"function");
    local_f0 = (*(code *)local_28[0x152])(fs_subroutine_indices[1],0x8b31,"function");
    if (((gs_subroutine_indices[0] == 0xffffffff) || (tc_subroutine_indices[0] == 0xffffffff)) ||
       ((te_subroutine_indices[0] == 0xffffffff ||
        ((vs_subroutine_indices[0] == 0xffffffff || (local_f0 == -1)))))) break;
    for (n_gs_subroutine = 0; (int)n_gs_subroutine < 0x20; n_gs_subroutine = n_gs_subroutine + 1) {
      uVar10 = (uint)((n_gs_subroutine & 1) != 0);
      n_gs_subroutine_00 = (uint)((n_gs_subroutine & 2) != 0);
      n_tc_subroutine_00 = (uint)((n_gs_subroutine & 4) != 0);
      configurations[4].indices._4_4_ = (uint)((n_gs_subroutine & 8) != 0);
      configurations[4].indices._0_4_ = (uint)((n_gs_subroutine & 0x10) != 0);
      local_ca8 = 0x8b30;
      i = GVar1;
      configurations[0]._0_8_ = gs_subroutine_indices + (ulong)uVar10 + 1;
      configurations[0].indices._0_4_ = 0x8dd9;
      configurations[0].indices._4_4_ = GVar2;
      configurations[1]._0_8_ = tc_subroutine_indices + (ulong)n_gs_subroutine_00 + 1;
      configurations[1].indices._0_4_ = 0x8e88;
      configurations[1].indices._4_4_ = GVar3;
      configurations[2]._0_8_ = te_subroutine_indices + (ulong)n_tc_subroutine_00 + 1;
      configurations[2].indices._0_4_ = 0x8e87;
      configurations[2].indices._4_4_ = GVar4;
      configurations[3]._0_8_ = vs_subroutine_indices + (ulong)configurations[4].indices._4_4_ + 1;
      configurations[3].indices._0_4_ = 0x8b31;
      configurations[3].indices._4_4_ = fs_subroutine_indices[1];
      configurations[4]._0_8_ = &n_subroutine + (uint)configurations[4].indices;
      for (local_cac = 0; local_cac < 5; local_cac = local_cac + 1) {
        (*(code *)*local_28)
                  (this->m_pipeline_id,
                   *(undefined4 *)((long)&configurations[(long)local_cac + -1].indices + 4));
        dVar8 = (*(code *)local_28[0x100])();
        glu::checkError(dVar8,"glActiveShaderProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x1c7f);
        uVar16._0_4_ = configurations[local_cac].stage;
        uVar16._4_4_ = configurations[local_cac].po_id;
        (*(code *)local_28[0x2cd])((&local_ca8)[(long)local_cac * 4],1,uVar16);
        dVar8 = (*(code *)local_28[0x100])();
        glu::checkError(dVar8,"glUniformSubroutinesuiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x1c82);
      }
      (*(code *)local_28[0x31])(0x4000);
      dVar8 = (*(code *)local_28[0x100])();
      glu::checkError(dVar8,"glClear() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1c87);
      (*(code *)local_28[0xa7])(0xe,0,1);
      dVar8 = (*(code *)local_28[0x100])();
      glu::checkError(dVar8,"glDrawArrays() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1c8a);
      (*(code *)local_28[0x244])
                (0,0,this->m_to_width,this->m_to_height,0x1908,0x1406,this->m_read_buffer);
      dVar8 = (*(code *)local_28[0x100])();
      glu::checkError(dVar8,"glReadPixels() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1c90);
      verifyReadBuffer(this,n_fs_id,uVar10,n_gs_id,n_gs_subroutine_00,n_tc_id,n_tc_subroutine_00,
                       n_te_id,configurations[4].indices._4_4_,n_vs_id,
                       (uint)configurations[4].indices);
    }
    n_gs_idx = n_gs_idx + 1;
  }
  pTVar17 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<
            ((MessageBuilder *)&n_fs_subroutine,pTVar17,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar18 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&n_fs_subroutine,
                       (char (*) [94])
                       "At least one subroutine uniform is considered inactive by glGetSubroutineUniformLocation (fs:"
                      );
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(int *)gs_subroutine_indices);
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [6])", gs:");
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(int *)tc_subroutine_indices);
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [6])", tc:");
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(int *)te_subroutine_indices);
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [6])", te:");
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(int *)vs_subroutine_indices);
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [6])", vs:");
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,&local_f0);
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [3])0x2c156ab);
  tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&n_fs_subroutine);
  pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar14,"At least one subroutine uniform is considered inactive",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0x1c61);
  __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest13::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine and GL_ARB_separate_shader_objects
	 * are not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_separate_shader_objects"))
	{
		throw tcu::NotSupportedError("GL_ARB_separate_shader_objects is not supported");
	}

	/* Initialize all GL objects before we continue */
	initTest();

	/* Iterate over all possible FS/GS/TC/TE/VS permutations */
	for (int n_shader_permutation = 0; n_shader_permutation < 32 /* 2^5 */; ++n_shader_permutation)
	{
		const unsigned int n_fs_idx = ((n_shader_permutation & (1 << 0)) != 0) ? 1 : 0;
		const unsigned int n_gs_idx = ((n_shader_permutation & (1 << 1)) != 0) ? 1 : 0;
		const unsigned int n_tc_idx = ((n_shader_permutation & (1 << 2)) != 0) ? 1 : 0;
		const unsigned int n_te_idx = ((n_shader_permutation & (1 << 3)) != 0) ? 1 : 0;
		const unsigned int n_vs_idx = ((n_shader_permutation & (1 << 4)) != 0) ? 1 : 0;
		const unsigned int fs_po_id = m_fs_po_ids[n_fs_idx];
		const unsigned int gs_po_id = m_gs_po_ids[n_gs_idx];
		const unsigned int tc_po_id = m_tc_po_ids[n_tc_idx];
		const unsigned int te_po_id = m_te_po_ids[n_te_idx];
		const unsigned int vs_po_id = m_vs_po_ids[n_vs_idx];

		/* Configure fragment shader stage */
		gl.useProgramStages(m_pipeline_id, GL_FRAGMENT_SHADER_BIT, fs_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed for GL_FRAGMENT_SHADER_BIT bit");

		/* Configure geometry shader stage */
		gl.useProgramStages(m_pipeline_id, GL_GEOMETRY_SHADER_BIT, gs_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed for GL_GEOMETRY_SHADER_BIT bit");

		/* Configure tessellation control shader stage */
		gl.useProgramStages(m_pipeline_id, GL_TESS_CONTROL_SHADER_BIT, tc_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed for GL_TESS_CONTROL_SHADER_BIT bit");

		/* Configure tessellation evaluation shader stage */
		gl.useProgramStages(m_pipeline_id, GL_TESS_EVALUATION_SHADER_BIT, te_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed for GL_TESS_EVALUATION_SHADER_BIT bit");

		/* Configure vertex shader stage */
		gl.useProgramStages(m_pipeline_id, GL_VERTEX_SHADER_BIT, vs_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed for GL_VERTEX_SHADER_BIT bit");

		/* Validate the pipeline */
		glw::GLint validate_status = GL_FALSE;

		gl.validateProgramPipeline(m_pipeline_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glValidateProgramPipeline() call failed.");

		gl.getProgramPipelineiv(m_pipeline_id, GL_VALIDATE_STATUS, &validate_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineiv() call failed.");

		if (validate_status != GL_TRUE)
		{
			TCU_FAIL("Program pipeline has not been validated successfully.");
		}

		/* Retrieve subroutine indices */
		GLuint fs_subroutine_indices[2]	= { (GLuint)-1 };
		GLint  fs_subroutine_uniform_index = 0;
		GLuint gs_subroutine_indices[2]	= { (GLuint)-1 };
		GLint  gs_subroutine_uniform_index = 0;
		GLuint tc_subroutine_indices[2]	= { (GLuint)-1 };
		GLint  tc_subroutine_uniform_index = 0;
		GLuint te_subroutine_indices[2]	= { (GLuint)-1 };
		GLint  te_subroutine_uniform_index = 0;
		GLuint vs_subroutine_indices[2]	= { (GLuint)-1 };
		GLint  vs_subroutine_uniform_index = 0;

		for (unsigned int n_subroutine = 0; n_subroutine < 2; ++n_subroutine)
		{
			std::stringstream fs_subroutine_name_sstream;
			std::stringstream gs_subroutine_name_sstream;
			std::stringstream tc_subroutine_name_sstream;
			std::stringstream te_subroutine_name_sstream;
			std::stringstream vs_subroutine_name_sstream;

			fs_subroutine_name_sstream << "SubroutineFS" << (n_subroutine + 1);
			gs_subroutine_name_sstream << "SubroutineGS" << (n_subroutine + 1);
			tc_subroutine_name_sstream << "SubroutineTC" << (n_subroutine + 1);
			te_subroutine_name_sstream << "SubroutineTE" << (n_subroutine + 1);
			vs_subroutine_name_sstream << "SubroutineVS" << (n_subroutine + 1);

			fs_subroutine_indices[n_subroutine] =
				gl.getSubroutineIndex(fs_po_id, GL_FRAGMENT_SHADER, fs_subroutine_name_sstream.str().c_str());
			gs_subroutine_indices[n_subroutine] =
				gl.getSubroutineIndex(gs_po_id, GL_GEOMETRY_SHADER, gs_subroutine_name_sstream.str().c_str());
			tc_subroutine_indices[n_subroutine] =
				gl.getSubroutineIndex(tc_po_id, GL_TESS_CONTROL_SHADER, tc_subroutine_name_sstream.str().c_str());
			te_subroutine_indices[n_subroutine] =
				gl.getSubroutineIndex(te_po_id, GL_TESS_EVALUATION_SHADER, te_subroutine_name_sstream.str().c_str());
			vs_subroutine_indices[n_subroutine] =
				gl.getSubroutineIndex(vs_po_id, GL_VERTEX_SHADER, vs_subroutine_name_sstream.str().c_str());
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineIndex() call(s) failed.");

			if (fs_subroutine_indices[n_subroutine] == (GLuint)-1 ||
				gs_subroutine_indices[n_subroutine] == (GLuint)-1 ||
				tc_subroutine_indices[n_subroutine] == (GLuint)-1 ||
				te_subroutine_indices[n_subroutine] == (GLuint)-1 || vs_subroutine_indices[n_subroutine] == (GLuint)-1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << "At least one subroutine was not recognized by glGetSubroutineIndex() call. "
									  "(fs:"
								   << fs_subroutine_indices[n_subroutine]
								   << ", gs:" << gs_subroutine_indices[n_subroutine]
								   << ", tc:" << tc_subroutine_indices[n_subroutine]
								   << ", te:" << te_subroutine_indices[n_subroutine]
								   << ", vs:" << vs_subroutine_indices[n_subroutine] << ")."
								   << tcu::TestLog::EndMessage;

				TCU_FAIL("At least one subroutine was not recognized");
			}
		} /* for (both subroutines) */

		/* Retrieve subroutine uniform indices */
		fs_subroutine_uniform_index = gl.getSubroutineUniformLocation(fs_po_id, GL_FRAGMENT_SHADER, "function");
		gs_subroutine_uniform_index = gl.getSubroutineUniformLocation(gs_po_id, GL_GEOMETRY_SHADER, "function");
		tc_subroutine_uniform_index = gl.getSubroutineUniformLocation(tc_po_id, GL_TESS_CONTROL_SHADER, "function");
		te_subroutine_uniform_index = gl.getSubroutineUniformLocation(te_po_id, GL_TESS_EVALUATION_SHADER, "function");
		vs_subroutine_uniform_index = gl.getSubroutineUniformLocation(vs_po_id, GL_VERTEX_SHADER, "function");

		if (fs_subroutine_uniform_index == -1 || gs_subroutine_uniform_index == -1 ||
			tc_subroutine_uniform_index == -1 || te_subroutine_uniform_index == -1 || vs_subroutine_uniform_index == -1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "At least one subroutine uniform is considered inactive by "
														   "glGetSubroutineUniformLocation ("
														   "fs:"
							   << fs_subroutine_uniform_index << ", gs:" << gs_subroutine_uniform_index
							   << ", tc:" << tc_subroutine_uniform_index << ", te:" << te_subroutine_uniform_index
							   << ", vs:" << vs_subroutine_uniform_index << ")." << tcu::TestLog::EndMessage;

			TCU_FAIL("At least one subroutine uniform is considered inactive");
		}

		/* Check if both subroutines work correctly in each stage */
		for (int n_subroutine_permutation = 0; n_subroutine_permutation < 32; /* 2^5 */
			 ++n_subroutine_permutation)
		{
			unsigned int n_fs_subroutine = ((n_subroutine_permutation & (1 << 0)) != 0) ? 1 : 0;
			unsigned int n_gs_subroutine = ((n_subroutine_permutation & (1 << 1)) != 0) ? 1 : 0;
			unsigned int n_tc_subroutine = ((n_subroutine_permutation & (1 << 2)) != 0) ? 1 : 0;
			unsigned int n_te_subroutine = ((n_subroutine_permutation & (1 << 3)) != 0) ? 1 : 0;
			unsigned int n_vs_subroutine = ((n_subroutine_permutation & (1 << 4)) != 0) ? 1 : 0;

			/* Configure subroutine uniforms */
			struct
			{
				glw::GLenum  stage;
				glw::GLuint  po_id;
				glw::GLuint* indices;
			} configurations[] = {
				{ GL_FRAGMENT_SHADER, fs_po_id, fs_subroutine_indices + n_fs_subroutine },
				{ GL_GEOMETRY_SHADER, gs_po_id, gs_subroutine_indices + n_gs_subroutine },
				{ GL_TESS_CONTROL_SHADER, tc_po_id, tc_subroutine_indices + n_tc_subroutine },
				{ GL_TESS_EVALUATION_SHADER, te_po_id, te_subroutine_indices + n_te_subroutine },
				{ GL_VERTEX_SHADER, vs_po_id, vs_subroutine_indices + n_vs_subroutine },
			};

			for (int i = 0; i < 5; ++i)
			{
				gl.activeShaderProgram(m_pipeline_id, configurations[i].po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveShaderProgram() call failed.");

				gl.uniformSubroutinesuiv(configurations[i].stage, 1 /* count */, configurations[i].indices);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformSubroutinesuiv() call failed.");
			}

			/* Render a full-screen quad with the pipeline */
			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");

			gl.drawArrays(GL_PATCHES, 0 /* first */, 1 /* count */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");

			/* Read color attachment's contents */
			gl.readPixels(0, /* x */
						  0, /* y */
						  m_to_width, m_to_height, GL_RGBA, GL_FLOAT, m_read_buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

			/* Verify the contents */
			verifyReadBuffer(n_fs_idx, n_fs_subroutine, n_gs_idx, n_gs_subroutine, n_tc_idx, n_tc_subroutine, n_te_idx,
							 n_te_subroutine, n_vs_idx, n_vs_subroutine);
		} /* for (all subroutine permutations) */
	}	 /* for (all program shader object permutations) */

	/** All done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}